

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsUtils.cpp
# Opt level: O0

bool initialiseScatterData(HighsInt max_num_point,HighsScatterData *scatter_data)

{
  int *in_RSI;
  int in_EDI;
  undefined4 in_stack_00000014;
  
  if (0 < in_EDI) {
    *in_RSI = in_EDI;
    in_RSI[1] = 0;
    in_RSI[2] = -1;
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)CONCAT44(in_stack_00000014,max_num_point),
               (size_type)scatter_data);
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)CONCAT44(in_stack_00000014,max_num_point),
               (size_type)scatter_data);
    *(undefined1 *)(in_RSI + 0x10) = 0;
    in_RSI[0x1e] = 0;
    in_RSI[0x1f] = 0;
    in_RSI[0x20] = 0;
    in_RSI[0x21] = 0;
    in_RSI[0x22] = 0;
    in_RSI[0x23] = 0;
    in_RSI[0x24] = 0;
    in_RSI[0x25] = 0;
    in_RSI[0x26] = 0;
  }
  return 0 < in_EDI;
}

Assistant:

bool initialiseScatterData(const HighsInt max_num_point,
                           HighsScatterData& scatter_data) {
  if (max_num_point < 1) return false;
  scatter_data.max_num_point_ = max_num_point;
  scatter_data.num_point_ = 0;
  scatter_data.last_point_ = -1;
  scatter_data.value0_.resize(max_num_point);
  scatter_data.value1_.resize(max_num_point);
  scatter_data.have_regression_coeff_ = false;
  scatter_data.num_error_comparison_ = 0;
  scatter_data.num_awful_linear_ = 0;
  scatter_data.num_awful_log_ = 0;
  scatter_data.num_bad_linear_ = 0;
  scatter_data.num_bad_log_ = 0;
  scatter_data.num_fair_linear_ = 0;
  scatter_data.num_fair_log_ = 0;
  scatter_data.num_better_linear_ = 0;
  scatter_data.num_better_log_ = 0;
  return true;
}